

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O3

void __thiscall Kvm::Kvm(Kvm *this)

{
  (this->interned_strings)._M_h._M_buckets = &(this->interned_strings)._M_h._M_single_bucket;
  (this->interned_strings)._M_h._M_bucket_count = 1;
  (this->interned_strings)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->interned_strings)._M_h._M_element_count = 0;
  (this->interned_strings)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->interned_strings)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->interned_strings)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->symbols)._M_h._M_buckets = &(this->symbols)._M_h._M_single_bucket;
  (this->symbols)._M_h._M_bucket_count = 1;
  (this->symbols)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->symbols)._M_h._M_element_count = 0;
  (this->symbols)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->symbols)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->symbols)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->gc_).numObjects_ = 0;
  (this->gc_).maxObjects_ = 0x100;
  memset(&(this->gc_).firstObject_,0,0x150);
  initialize(this);
  return;
}

Assistant:

Kvm::Kvm()
{
    initialize();
}